

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

ostream * operator<<(ostream *o,span<int> *d)

{
  int *piVar1;
  ostream *this;
  ulong uVar2;
  ulong uVar3;
  char local_29;
  
  if (3 < d->_len) {
    piVar1 = d->_base;
    uVar3 = d->_len & 0xfffffffffffffffc;
    std::ostream::operator<<((ostream *)o,*piVar1);
    if (uVar3 != 4) {
      uVar2 = 4;
      do {
        local_29 = ' ';
        this = std::__ostream_insert<char,std::char_traits<char>>(o,&local_29,1);
        std::ostream::operator<<((ostream *)this,*(int *)((long)piVar1 + uVar2));
        uVar2 = uVar2 + 4;
      } while (uVar3 != uVar2);
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}